

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O0

DictionaryMatcher * __thiscall
icu_63::ICULanguageBreakFactory::loadDictionaryMatcherFor
          (ICULanguageBreakFactory *this,UScriptCode script)

{
  int iVar1;
  int32_t t;
  UBool UVar2;
  UResourceBundle *resB;
  char *pcVar3;
  UChar *s;
  char *name;
  UDataMemory *pData;
  int *piVar4;
  BytesDictionaryMatcher *pBVar5;
  BytesDictionaryMatcher *local_218;
  BytesDictionaryMatcher *local_208;
  UChar *characters_1;
  char *characters;
  BytesDictionaryMatcher *pBStack_190;
  int32_t transform;
  DictionaryMatcher *m;
  int32_t trieType;
  int32_t offset;
  int32_t *indexes;
  uint8_t *data;
  UDataMemory *file;
  UnicodeString local_160;
  ConstChar16Ptr local_120;
  UnicodeString local_118;
  uint local_d4;
  UChar *pUStack_d0;
  int32_t len;
  UChar *extStart;
  undefined1 local_b8 [8];
  CharString ext;
  CharString dictnbuf;
  UChar *dictfname;
  UResourceBundle *pUStack_28;
  int32_t dictnlength;
  UResourceBundle *b;
  UErrorCode status;
  UScriptCode script_local;
  ICULanguageBreakFactory *this_local;
  
  b._0_4_ = U_ZERO_ERROR;
  b._4_4_ = script;
  _status = this;
  pUStack_28 = ures_open_63("icudt63l-brkitr","",(UErrorCode *)&b);
  resB = ures_getByKeyWithFallback_63(pUStack_28,"dictionaries",pUStack_28,(UErrorCode *)&b);
  dictfname._4_4_ = 0;
  pUStack_28 = resB;
  pcVar3 = uscript_getShortName_63(b._4_4_);
  s = ures_getStringByKeyWithFallback_63
                (resB,pcVar3,(int32_t *)((long)&dictfname + 4),(UErrorCode *)&b);
  UVar2 = ::U_FAILURE((UErrorCode)b);
  if (UVar2 == '\0') {
    CharString::CharString((CharString *)&ext.len);
    CharString::CharString((CharString *)local_b8);
    pUStack_d0 = u_memrchr_63(s,L'.',dictfname._4_4_);
    if (pUStack_d0 != (UChar *)0x0) {
      local_d4 = (uint)((ulong)((long)pUStack_d0 - (long)s) >> 1);
      ConstChar16Ptr::ConstChar16Ptr(&local_120,pUStack_d0 + 1);
      UnicodeString::UnicodeString(&local_118,'\0',&local_120,~local_d4 + dictfname._4_4_);
      CharString::appendInvariantChars((CharString *)local_b8,&local_118,(UErrorCode *)&b);
      UnicodeString::~UnicodeString(&local_118);
      ConstChar16Ptr::~ConstChar16Ptr(&local_120);
      dictfname._4_4_ = local_d4;
    }
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&file,s);
    UnicodeString::UnicodeString(&local_160,'\0',(ConstChar16Ptr *)&file,dictfname._4_4_);
    CharString::appendInvariantChars((CharString *)&ext.len,&local_160,(UErrorCode *)&b);
    UnicodeString::~UnicodeString(&local_160);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&file);
    ures_close_63(pUStack_28);
    pcVar3 = CharString::data((CharString *)local_b8);
    name = CharString::data((CharString *)&ext.len);
    pData = udata_open_63("icudt63l-brkitr",pcVar3,name,(UErrorCode *)&b);
    UVar2 = ::U_SUCCESS((UErrorCode)b);
    if (UVar2 == '\0') {
      if (s == (UChar *)0x0) {
        this_local = (ICULanguageBreakFactory *)0x0;
      }
      else {
        b._0_4_ = U_ZERO_ERROR;
        this_local = (ICULanguageBreakFactory *)0x0;
      }
    }
    else {
      piVar4 = (int *)udata_getMemory_63(pData);
      iVar1 = *piVar4;
      pBStack_190 = (BytesDictionaryMatcher *)0x0;
      if ((piVar4[4] & 7U) == 0) {
        t = piVar4[5];
        pBVar5 = (BytesDictionaryMatcher *)UMemory::operator_new((UMemory *)0x20,(size_t)pcVar3);
        local_208 = (BytesDictionaryMatcher *)0x0;
        if (pBVar5 != (BytesDictionaryMatcher *)0x0) {
          BytesDictionaryMatcher::BytesDictionaryMatcher
                    (pBVar5,(char *)((long)piVar4 + (long)iVar1),t,pData);
          local_208 = pBVar5;
        }
        pBStack_190 = local_208;
      }
      else if ((piVar4[4] & 7U) == 1) {
        pBVar5 = (BytesDictionaryMatcher *)UMemory::operator_new((UMemory *)0x18,(size_t)pcVar3);
        local_218 = (BytesDictionaryMatcher *)0x0;
        if (pBVar5 != (BytesDictionaryMatcher *)0x0) {
          UCharsDictionaryMatcher::UCharsDictionaryMatcher
                    ((UCharsDictionaryMatcher *)pBVar5,(UChar *)((long)piVar4 + (long)iVar1),pData);
          local_218 = pBVar5;
        }
        pBStack_190 = local_218;
      }
      if (pBStack_190 == (BytesDictionaryMatcher *)0x0) {
        udata_close_63(pData);
      }
      this_local = (ICULanguageBreakFactory *)pBStack_190;
    }
    CharString::~CharString((CharString *)local_b8);
    CharString::~CharString((CharString *)&ext.len);
  }
  else {
    ures_close_63(pUStack_28);
    this_local = (ICULanguageBreakFactory *)0x0;
  }
  return (DictionaryMatcher *)this_local;
}

Assistant:

DictionaryMatcher *
ICULanguageBreakFactory::loadDictionaryMatcherFor(UScriptCode script) { 
    UErrorCode status = U_ZERO_ERROR;
    // open root from brkitr tree.
    UResourceBundle *b = ures_open(U_ICUDATA_BRKITR, "", &status);
    b = ures_getByKeyWithFallback(b, "dictionaries", b, &status);
    int32_t dictnlength = 0;
    const UChar *dictfname =
        ures_getStringByKeyWithFallback(b, uscript_getShortName(script), &dictnlength, &status);
    if (U_FAILURE(status)) {
        ures_close(b);
        return NULL;
    }
    CharString dictnbuf;
    CharString ext;
    const UChar *extStart = u_memrchr(dictfname, 0x002e, dictnlength);  // last dot
    if (extStart != NULL) {
        int32_t len = (int32_t)(extStart - dictfname);
        ext.appendInvariantChars(UnicodeString(FALSE, extStart + 1, dictnlength - len - 1), status);
        dictnlength = len;
    }
    dictnbuf.appendInvariantChars(UnicodeString(FALSE, dictfname, dictnlength), status);
    ures_close(b);

    UDataMemory *file = udata_open(U_ICUDATA_BRKITR, ext.data(), dictnbuf.data(), &status);
    if (U_SUCCESS(status)) {
        // build trie
        const uint8_t *data = (const uint8_t *)udata_getMemory(file);
        const int32_t *indexes = (const int32_t *)data;
        const int32_t offset = indexes[DictionaryData::IX_STRING_TRIE_OFFSET];
        const int32_t trieType = indexes[DictionaryData::IX_TRIE_TYPE] & DictionaryData::TRIE_TYPE_MASK;
        DictionaryMatcher *m = NULL;
        if (trieType == DictionaryData::TRIE_TYPE_BYTES) {
            const int32_t transform = indexes[DictionaryData::IX_TRANSFORM];
            const char *characters = (const char *)(data + offset);
            m = new BytesDictionaryMatcher(characters, transform, file);
        }
        else if (trieType == DictionaryData::TRIE_TYPE_UCHARS) {
            const UChar *characters = (const UChar *)(data + offset);
            m = new UCharsDictionaryMatcher(characters, file);
        }
        if (m == NULL) {
            // no matcher exists to take ownership - either we are an invalid 
            // type or memory allocation failed
            udata_close(file);
        }
        return m;
    } else if (dictfname != NULL) {
        // we don't have a dictionary matcher.
        // returning NULL here will cause us to fail to find a dictionary break engine, as expected
        status = U_ZERO_ERROR;
        return NULL;
    }
    return NULL;
}